

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

int __thiscall IntElemBoundsImp<0,_4,_0>::checkSatisfied(IntElemBoundsImp<0,_4,_0> *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  vec<IntView<0>_> *this_00;
  int64_t iVar4;
  long in_RDI;
  Tchar *unaff_retaddr;
  BoolView *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffffc;
  char o;
  
  o = (char)((uint)in_stack_fffffffffffffffc >> 0x18);
  cVar1 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x10));
  if (cVar1 != '\0') {
    return 1;
  }
  bVar2 = BoolView::isFixed((BoolView *)0x25b47b);
  if ((!bVar2) || (iVar3 = BoolView::getVal(in_stack_ffffffffffffffe0), iVar3 != 0)) {
    bVar2 = BoolView::isFixed((BoolView *)0x25b4a2);
    if (!bVar2) {
      return 3;
    }
    bVar2 = IntView<4>::isFixed((IntView<4> *)0x25b4b6);
    if (!bVar2) {
      return 3;
    }
    bVar2 = IntView<0>::isFixed((IntView<0> *)0x25b4ca);
    if (!bVar2) {
      return 3;
    }
    this_00 = (vec<IntView<0>_> *)(in_RDI + 0x48);
    iVar4 = IntView<4>::getVal((IntView<4> *)this_00);
    vec<IntView<0>_>::operator[](this_00,(uint)iVar4);
    bVar2 = IntView<0>::isFixed((IntView<0> *)0x25b4fe);
    if (!bVar2) {
      return 3;
    }
  }
  Tchar::operator=(unaff_retaddr,o);
  return 3;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if ((b.isFixed() && (b.getVal() == 0)) ||
				(b.isFixed() && x.isFixed() && y.isFixed() && a[static_cast<int>(x.getVal())].isFixed())) {
			satisfied = true;
		}
		return 3;
	}